

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bandit_run_policy.h
# Opt level: O3

bool __thiscall
bandit::detail::bandit_run_policy::matches_only_pattern(bandit_run_policy *this,char *name)

{
  long lVar1;
  string n;
  allocator local_31;
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  std::__cxx11::string::string((string *)local_30,name,&local_31);
  lVar1 = std::__cxx11::string::find
                    ((char *)local_30,(ulong)(this->only_pattern_)._M_dataplus._M_p,0);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0]);
  }
  return lVar1 != -1;
}

Assistant:

bool matches_only_pattern(const char* name) const
    {
      std::string n(name);
      return matches_only_pattern(n);
    }